

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall
SuffixTree::GeneralizedSuffixTree::FindAnswers
          (GeneralizedSuffixTree *this,Node *node,uint cur_substring_length)

{
  uint uVar1;
  pointer ppVar2;
  _Hash_node_base *p_Var3;
  
  for (p_Var3 = (node->edges)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    if (*(int *)&p_Var3[4]._M_nxt != 0) {
      FindAnswers(this,(Node *)p_Var3[2]._M_nxt,*(int *)&p_Var3[4]._M_nxt + cur_substring_length);
    }
  }
  uVar1 = node->num_leaves - node->num_lca;
  if (1 < uVar1) {
    uVar1 = uVar1 - 1;
    ppVar2 = (this->answers).
             super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar2[uVar1].second < cur_substring_length) {
      ppVar2 = ppVar2 + uVar1;
      ppVar2->first = node;
      ppVar2->second = cur_substring_length;
    }
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::FindAnswers (Node *node, uint cur_substring_length)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
            FindAnswers (edge_pair.second.node, cur_substring_length + edge_pair.second.length);
    uint num_substrings = node->num_leaves - node->num_lca;
    if (num_substrings > 1 && cur_substring_length > answers[num_substrings - 1].second)
        answers[num_substrings - 1] = std::pair<Node *, uint> (node, cur_substring_length);
}